

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O1

mpt_metatype * mpt_iterator_string(char *val,char *sep)

{
  size_t __n;
  size_t __n_00;
  mpt_metatype *pmVar1;
  _mpt_vptr_metatype *__dest;
  
  if (val == (char *)0x0) {
    __n = 0;
    __n_00 = 0;
  }
  else {
    if (sep == (char *)0x0) {
      sep = " ,;/:";
    }
    __n = strlen(sep);
    __n_00 = strlen(val);
  }
  pmVar1 = (mpt_metatype *)malloc(__n_00 + __n + 0x52);
  if (pmVar1 == (mpt_metatype *)0x0) {
    pmVar1 = (mpt_metatype *)0x0;
  }
  else {
    pmVar1->_vptr = &mpt_iterator_string::ctlMeta;
    pmVar1[1]._vptr = (_mpt_vptr_metatype *)&mpt_iterator_string::ctlIter;
    pmVar1[2]._vptr = (_mpt_vptr_metatype *)&mpt_iterator_string::ctlConv;
    pmVar1[3]._vptr = (_mpt_vptr_metatype *)(pmVar1 + 5);
    pmVar1[4]._vptr = (_mpt_vptr_metatype *)0x80;
    pmVar1[5]._vptr = (_mpt_vptr_metatype *)(pmVar1 + 2);
    if (__n != 0) {
      memcpy(pmVar1 + 10,sep,__n);
    }
    __dest = (_mpt_vptr_metatype *)((long)&pmVar1[10]._vptr + __n + 1);
    *(undefined1 *)((long)&__dest[-1].clone + 7) = 0;
    if (__n_00 != 0) {
      memcpy(__dest,val,__n_00);
    }
    *(undefined1 *)((long)&(__dest->convertable).convert + __n_00) = 0;
    pmVar1[6]._vptr = __dest;
    pmVar1[7]._vptr = (_mpt_vptr_metatype *)((long)&(__dest->convertable).convert + __n_00);
    pmVar1[8]._vptr = (_mpt_vptr_metatype *)0x0;
    *(undefined1 *)&pmVar1[9]._vptr = 0;
  }
  return pmVar1;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_string(const char *val, const char *sep)
{
	static const MPT_INTERFACE_VPTR(metatype) ctlMeta = {
		{ parseConv },
		parseUnref,
		parseRef,
		parseClone
	};
	static const MPT_INTERFACE_VPTR(iterator) ctlIter = {
		parseValue,
		parseAdvance,
		parseReset
	};
	static const MPT_INTERFACE_VPTR(convertable) ctlConv = {
		parseConvertElement
	};
	MPT_STRUCT(parseIterator) *it;
	size_t slen, vlen;
	char *dest;
	
	/* no need for separator */
	if (!val) {
		slen = vlen = 0;
	}
	else {
		if (!sep) {
			sep = " ,;/:";
		}
		slen = strlen(sep);
		vlen = strlen(val);
	}
	/* memory for header, constent and string separation/end */
	if (!(it = malloc(sizeof(*it) + slen + vlen + 2))) {
		return 0;
	}
	it->_mt._vptr = &ctlMeta;
	it->_it._vptr = &ctlIter;
	
	it->elem._conv._vptr = &ctlConv;
	MPT_value_set(&it->elem.val, MPT_ENUM(TypeConvertablePtr), &it->conv_ptr);
	it->conv_ptr = &it->elem._conv;
	
	/* save separator config */
	dest = (char *) (it + 1);
	if (slen) {
		memcpy(dest, sep, slen);
	}
	dest[slen++] = '\0';
	
	/* save value content */
	dest += slen;
	if (vlen) {
		memcpy(dest, val, vlen);
	}
	dest[vlen] = '\0';
	
	/* setup iterator data */
	it->val = dest;
	it->end = dest + vlen;
	it->restore = 0;
	it->save = 0;
	
	return &it->_mt;
}